

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<std::vector<(anonymous_namespace)::ns::Employee_NCGN,std::allocator<(anonymous_namespace)::ns::Employee_NCGN>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  pointer __first;
  pointer __last;
  bool bVar1;
  _Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  *this_00;
  pointer __result;
  iterator this_01;
  conv_error *this_02;
  _Tp_alloc_type *in_RCX;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *__n;
  ulong uVar2;
  const_array_range_type cVar3;
  error_code ec;
  type local_70;
  
  __n = this;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar1) {
    this_02 = (conv_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)&local_70,not_vector);
    ec._4_4_ = 0;
    ec._M_value = (uint)local_70.name_._M_dataplus._M_p;
    ec._M_cat = (error_category *)local_70.name_._M_string_length;
    conv_error::conv_error(this_02,ec);
    __cxa_throw(this_02,&conv_error::typeinfo,conv_error::~conv_error);
  }
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
             *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if ((ulong)this_00 >> 0x39 == 0) {
    __first = (__return_storage_ptr__->
              super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(__return_storage_ptr__->
                  super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    if ((_Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
         *)((long)uVar2 >> 6) < this_00) {
      __last = (__return_storage_ptr__->
               super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      __result = std::
                 _Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
                 ::_M_allocate(this_00,(size_t)__n);
      std::
      vector<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      ::_S_relocate(__first,__last,__result,in_RCX);
      if (__first != (pointer)0x0) {
        operator_delete(__first,uVar2);
      }
      (__return_storage_ptr__->
      super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      )._M_impl.super__Vector_impl_data._M_start = __result;
      (__return_storage_ptr__->
      super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((long)__last - (long)__first) + (long)__result);
      (__return_storage_ptr__->
      super__Vector_base<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
    }
    cVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    this_01 = cVar3.first_._M_current;
    if (this_01._M_current != cVar3.last_._M_current._M_current) {
      do {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
        as<(anonymous_namespace)::ns::Employee_NCGN>(&local_70,this_01._M_current);
        std::
        vector<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
        ::push_back(__return_storage_ptr__,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.surname_._M_dataplus._M_p != &local_70.surname_.field_2) {
          operator_delete(local_70.surname_._M_dataplus._M_p,
                          local_70.surname_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_70.name_._M_dataplus._M_p._4_4_,(uint)local_70.name_._M_dataplus._M_p)
            != &local_70.name_.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_70.name_._M_dataplus._M_p._4_4_,
                                   (uint)local_70.name_._M_dataplus._M_p),
                          local_70.name_.field_2._M_allocated_capacity + 1);
        }
        this_01._M_current = this_01._M_current + 1;
      } while (this_01._M_current != cVar3.last_._M_current._M_current);
    }
    return __return_storage_ptr__;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }